

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedCtor(BatchnormLayerParams *this)

{
  BatchnormLayerParams *this_local;
  
  memset(&this->gamma_,0,0x30);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BatchnormLayerParams::SharedCtor() {
  ::memset(&gamma_, 0, reinterpret_cast<char*>(&epsilon_) -
    reinterpret_cast<char*>(&gamma_) + sizeof(epsilon_));
  _cached_size_ = 0;
}